

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

int ftp_domore_getsock(connectdata *conn,curl_socket_t *socks,int numsocks)

{
  int local_3c;
  int local_38;
  int i;
  int s;
  int bits;
  ftp_conn *ftpc;
  int numsocks_local;
  curl_socket_t *socks_local;
  connectdata *conn_local;
  
  if (numsocks == 0) {
    conn_local._4_4_ = 0;
  }
  else if ((conn->proto).ftpc.state == FTP_STOP) {
    i = 1;
    *socks = conn->sock[0];
    if (((conn->data->set).ftp_use_port & 1U) == 0) {
      local_38 = 1;
      for (local_3c = 0; local_3c < 2; local_3c = local_3c + 1) {
        if (conn->tempsock[local_3c] != -1) {
          socks[local_38] = conn->tempsock[local_3c];
          i = 1 << ((char)local_38 + 0x10U & 0x1f) | i;
          local_38 = local_38 + 1;
        }
      }
    }
    else {
      socks[1] = conn->sock[1];
      i = 0x20003;
    }
    conn_local._4_4_ = i;
  }
  else {
    conn_local._4_4_ = Curl_pp_getsock(&(conn->proto).ftpc.pp,socks,numsocks);
  }
  return conn_local._4_4_;
}

Assistant:

static int ftp_domore_getsock(struct connectdata *conn, curl_socket_t *socks,
                              int numsocks)
{
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  if(!numsocks)
    return GETSOCK_BLANK;

  /* When in DO_MORE state, we could be either waiting for us to connect to a
   * remote site, or we could wait for that site to connect to us. Or just
   * handle ordinary commands.
   */

  if(FTP_STOP == ftpc->state) {
    int bits = GETSOCK_READSOCK(0);

    /* if stopped and still in this state, then we're also waiting for a
       connect on the secondary connection */
    socks[0] = conn->sock[FIRSTSOCKET];

    if(!conn->data->set.ftp_use_port) {
      int s;
      int i;
      /* PORT is used to tell the server to connect to us, and during that we
         don't do happy eyeballs, but we do if we connect to the server */
      for(s=1, i=0; i<2; i++) {
        if(conn->tempsock[i] != CURL_SOCKET_BAD) {
          socks[s] = conn->tempsock[i];
          bits |= GETSOCK_WRITESOCK(s++);
        }
      }
    }
    else {
      socks[1] = conn->sock[SECONDARYSOCKET];
      bits |= GETSOCK_WRITESOCK(1) | GETSOCK_READSOCK(1);
    }

    return bits;
  }
  return Curl_pp_getsock(&conn->proto.ftpc.pp, socks, numsocks);
}